

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result wabt::ValidateScript(Script *script,Errors *errors,ValidateOptions *options)

{
  pointer puVar1;
  Command *pCVar2;
  Action *action;
  anon_union_8_2_516a9242_for_ActionResult_2 *paVar3;
  char *in_R8;
  pointer puVar4;
  ActionResult AVar5;
  ScriptValidator validator;
  ScriptValidator local_300;
  Expectation *local_2e0;
  Validator local_2d8;
  
  local_300.result_.enum_ = Ok;
  puVar1 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_300.script_ = script;
  local_300.errors_ = errors;
  local_300.options_ = options;
  for (puVar4 = (script->commands).
                super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    pCVar2 = (puVar4->_M_t).
             super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
             super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    switch(pCVar2->type) {
    case First:
    case ScriptModule:
      local_2d8.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_00245f28;
      local_2d8.options_ = local_300.options_;
      local_2d8.errors_ = local_300.errors_;
      SharedValidator::SharedValidator(&local_2d8.validator_,local_300.errors_,local_300.options_);
      local_2d8.result_.enum_ = Ok;
      local_2d8.current_module_ = (Module *)(pCVar2 + 1);
      anon_unknown_4::Validator::CheckModule(&local_2d8);
      local_2d8.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_00245f28;
      SharedValidator::~SharedValidator(&local_2d8.validator_);
      break;
    case Action:
    case AssertTrap:
    case AssertExhaustion:
    case AssertException:
      anon_unknown_4::ScriptValidator::CheckAction(&local_300,(Action *)pCVar2[1]._vptr_Command);
      break;
    case AssertReturn:
      action = (Action *)pCVar2[1]._vptr_Command;
      AVar5 = anon_unknown_4::ScriptValidator::CheckAction(&local_300,action);
      if (AVar5.kind == Type) {
        local_2d8.super_Delegate._vptr_Delegate = (_func_int **)0x0;
        local_2d8.options_ = (ValidateOptions *)0x0;
        local_2d8.errors_ = (Errors *)0x0;
        local_2e0 = *(Expectation **)&pCVar2[1].type;
        paVar3 = (anon_union_8_2_516a9242_for_ActionResult_2 *)operator_new(8);
        local_2d8.options_ = (ValidateOptions *)(paVar3 + 1);
        paVar3->types = (TypeVector *)AVar5.field_1;
        local_2d8.super_Delegate._vptr_Delegate = (_func_int **)paVar3;
        local_2d8.errors_ = (Errors *)local_2d8.options_;
        anon_unknown_4::ScriptValidator::CheckExpectationTypes
                  (&local_300,&action->loc,(TypeVector *)&local_2d8,local_2e0,in_R8);
        operator_delete(paVar3,8);
      }
      else if (AVar5.kind == Types) {
        anon_unknown_4::ScriptValidator::CheckExpectationTypes
                  (&local_300,&action->loc,AVar5.field_1.types,*(Expectation **)&pCVar2[1].type,
                   in_R8);
      }
    }
  }
  return (Result)local_300.result_.enum_;
}

Assistant:

ScriptValidator::ScriptValidator(Errors* errors,
                                 const Script* script,
                                 const ValidateOptions& options)
    : options_(options), errors_(errors), script_(script) {}